

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *__return_storage_ptr__,text *arg)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [39];
  byte local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  byte local_d5;
  byte local_c1;
  string local_c0 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  long local_20;
  size_type pos;
  text *arg_local;
  
  pos = (size_type)arg;
  arg_local = &__return_storage_ptr__->first;
  local_20 = std::__cxx11::string::rfind((char)arg,0x3d);
  local_c1 = 0;
  local_d5 = 0;
  local_139 = 0;
  bVar1 = local_20 != -1;
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_138,(ulong)arg);
    local_139 = 1;
    std::__cxx11::string::substr((ulong)local_160,(ulong)arg);
    std::make_pair<std::__cxx11::string,std::__cxx11::string>(&local_118,local_138,local_160);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair(&local_60,&local_118);
  }
  else {
    std::__cxx11::string::string(local_c0);
    local_c1 = 1;
    std::make_pair<std::__cxx11::string&,std::__cxx11::string>
              (&local_a0,arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    local_d5 = 1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair(&local_60,&local_a0);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair(__return_storage_ptr__,&local_60);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_60);
  if (bVar1) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_118);
    std::__cxx11::string::~string((string *)local_160);
  }
  if ((local_139 & 1) != 0) {
    std::__cxx11::string::~string((string *)local_138);
  }
  if ((local_d5 & 1) != 0) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_a0);
  }
  if ((local_c1 & 1) != 0) {
    std::__cxx11::string::~string(local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<text, text>
split_option( text arg )
{
    text::size_type pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_pair( arg, text() )
                : std::make_pair( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}